

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O1

bool test_remove_gap4b(Data *data,int offset)

{
  pointer puVar1;
  LogHelper *pLVar2;
  int iVar3;
  bool bVar4;
  uint8_t fill;
  int len;
  TrackDataParser parser;
  uint8_t local_41;
  int local_40;
  int local_3c;
  TrackDataParser local_38;
  
  puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar1;
  bVar4 = false;
  if (offset <= iVar3) {
    TrackDataParser::TrackDataParser(&local_38,puVar1 + offset,iVar3 - offset);
    local_3c = 0;
    local_40 = 0;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [16])"----gap4b----:\n");
    }
    TrackDataParser::GetGapRun(&local_38,&local_40,&local_41,(bool *)0x0);
    if (local_40 == 0) {
      local_3c = 1;
      iVar3 = TrackDataParser::GetGapRun(&local_38,&local_40,&local_41,(bool *)0x0);
      if ((iVar3 != 0) && (local_40 == 0)) {
        do {
          local_3c = local_3c + 1;
          iVar3 = TrackDataParser::GetGapRun(&local_38,&local_40,&local_41,(bool *)0x0);
          if (iVar3 == 0) break;
        } while (local_40 == 0);
      }
      if (opt.debug != 0) {
        pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
        pLVar2 = util::operator<<(pLVar2,&local_3c);
        util::operator<<(pLVar2,(char (*) [14])0x1ae41d);
      }
    }
    if (0 < local_40) {
      if ((local_41 == 'N') || (local_41 == '\0')) {
        if (opt.debug != 0) {
          pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
          pLVar2 = util::operator<<(pLVar2,&local_40);
          pLVar2 = util::operator<<(pLVar2,(char (*) [11])" bytes of ");
          pLVar2 = util::operator<<(pLVar2,&local_41);
          util::operator<<(pLVar2,(char (*) [9])" filler\n");
        }
      }
      else if (0 < local_40) {
        if (opt.debug != 0) {
          pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [17])"stopping due to ");
          pLVar2 = util::operator<<(pLVar2,&local_40);
          pLVar2 = util::operator<<(pLVar2,(char (*) [11])" bytes of ");
          pLVar2 = util::operator<<(pLVar2,&local_41);
          util::operator<<(pLVar2,(char (*) [9])" filler\n");
        }
        return false;
      }
    }
    bVar4 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [22])"gap4b can be removed\n");
    }
  }
  return bVar4;
}

Assistant:

bool test_remove_gap4b(const Data& data, int offset)
{
    if (data.size() < offset)
        return false;

    TrackDataParser parser(data.data() + offset, data.size() - offset);
    auto splice = 0, len = 0;
    uint8_t fill;

    if (opt.debug) util::cout << "----gap4b----:\n";

    parser.GetGapRun(len, fill);

    if (!len)
    {
        splice = 1;
        for (; parser.GetGapRun(len, fill) && !len; ++splice);
        if (opt.debug) util::cout << "found " << splice << " splice bits\n";
        /*
        auto max_splice = (opt.maxsplice == -1) ? DEFAULT_MAX_SPLICE : opt.maxsplice;
        if (splice > max_splice)
        {
        if (opt.debug) util::cout << "stopping due to too many splice bits\n";
        return false;
        }
        */
    }

    if (len > 0 && (fill == 0x4e || fill == 0x00))
    {
        if (opt.debug) util::cout << "found " << len << " bytes of " << fill << " filler\n";
    }
    else if (len > 0)
    {
        if (opt.debug) util::cout << "stopping due to " << len << " bytes of " << fill << " filler\n";
        return false;
    }

    if (opt.debug) util::cout << "gap4b can be removed\n";
    return true;
}